

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void parasail_matrix_free(parasail_matrix_t *matrix)

{
  char *pcVar1;
  char *__format;
  
  if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar1 = "matrix";
  }
  else {
    if (matrix->user_matrix != (int *)0x0) {
      free(matrix->matrix);
      free(matrix->mapper);
      free(matrix->alphabet);
      free(matrix->query);
      free(matrix);
      return;
    }
    pcVar1 = matrix->name;
    __format = "%s: attempted to free built-in matrix \'%s\'\n";
  }
  fprintf(_stderr,__format,"parasail_matrix_free",pcVar1);
  return;
}

Assistant:

void parasail_matrix_free(parasail_matrix_t *matrix)
{
    /* validate inputs */
    PARASAIL_CHECK_NULL_NORETVAL(matrix);

    if (NULL != matrix->user_matrix) {
        free((void*)matrix->matrix);
        free((void*)matrix->mapper);
        free((void*)matrix->alphabet);
        if (matrix->query) free((void*)matrix->query);
        free(matrix);
    }
    else {
        fprintf(stderr, "%s: attempted to free built-in matrix '%s'\n",
                __func__, matrix->name);
    }
}